

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool duckdb::MultiplyPropagateStatistics::Operation<signed_char,duckdb::TryDecimalMultiply>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  char left;
  LogicalType *type_00;
  bool bVar1;
  LogicalTypeId LVar2;
  ulong uVar3;
  LogicalTypeId LVar4;
  idx_t r;
  long lVar5;
  char rvals [2];
  char lvals [2];
  char result;
  char local_8c [4];
  Value *local_88;
  LogicalType *local_80;
  Value *local_78;
  Value local_70;
  
  local_88 = new_min;
  local_80 = type;
  local_78 = new_max;
  local_8c[2] = NumericStats::GetMin<signed_char>(lstats);
  local_8c[3] = NumericStats::GetMax<signed_char>(lstats);
  local_8c[0] = NumericStats::GetMin<signed_char>(rstats);
  local_8c[1] = NumericStats::GetMax<signed_char>(rstats);
  LVar2 = 0x80;
  LVar4 = 0x7f;
  for (uVar3 = 0; type_00 = local_80, uVar3 != 2; uVar3 = uVar3 + 1) {
    left = local_8c[uVar3 + 2];
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      bVar1 = TryDecimalMultiply::Operation<signed_char,signed_char,signed_char>
                        (left,local_8c[lVar5],(char *)&local_70);
      if (!bVar1) goto LAB_01502390;
      if ((char)local_70.type_.id_ < (char)LVar4) {
        LVar4 = local_70.type_.id_;
      }
      if ((char)LVar2 < (char)local_70.type_.id_) {
        LVar2 = local_70.type_.id_;
      }
    }
  }
  Value::Numeric(&local_70,local_80,(long)(char)LVar4);
  Value::operator=(local_88,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type_00,(long)(char)LVar2);
  Value::operator=(local_78,&local_70);
  Value::~Value(&local_70);
LAB_01502390:
  return uVar3 < 2;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}